

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p.c
# Opt level: O3

int envy_bios_parse_p_falcon_ucode(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  int iVar5;
  envy_bios_p_falcon_ucode_entry *peVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  uVar2 = (bios->p).falcon_ucode.offset;
  iVar18 = -0x16;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      uVar4 = bios->data[(uint)uVar2];
      (bios->p).falcon_ucode.version = uVar4;
    }
    else {
      (bios->p).falcon_ucode.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = (bios->p).falcon_ucode.version;
    }
    if (uVar4 == '\x01') {
      uVar13 = (ulong)(bios->p).falcon_ucode.offset;
      uVar20 = bios->length;
      if ((uint)(uVar13 + 1) < uVar20) {
        (bios->p).falcon_ucode.hlen = bios->data[uVar13 + 1];
        iVar18 = 0;
      }
      else {
        (bios->p).falcon_ucode.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar13 = (ulong)(bios->p).falcon_ucode.offset;
        uVar20 = bios->length;
        iVar18 = -0xe;
      }
      if ((uint)(uVar13 + 2) < uVar20) {
        (bios->p).falcon_ucode.rlen = bios->data[uVar13 + 2];
        iVar11 = 0;
      }
      else {
        (bios->p).falcon_ucode.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar13 = (ulong)(bios->p).falcon_ucode.offset;
        uVar20 = bios->length;
        iVar11 = -0xe;
      }
      if ((uint)(uVar13 + 3) < uVar20) {
        (bios->p).falcon_ucode.entriesnum = bios->data[uVar13 + 3];
        iVar8 = 0;
      }
      else {
        (bios->p).falcon_ucode.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar13 = (ulong)(bios->p).falcon_ucode.offset;
        uVar20 = bios->length;
        iVar8 = -0xe;
      }
      uVar7 = (uint)uVar13;
      if ((uint)(uVar13 + 4) < uVar20) {
        (bios->p).falcon_ucode.desc_version = bios->data[uVar13 + 4];
        iVar9 = 0;
      }
      else {
        (bios->p).falcon_ucode.desc_version = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar7 = (uint)(bios->p).falcon_ucode.offset;
        uVar20 = bios->length;
        iVar9 = -0xe;
      }
      if ((uint)((ulong)uVar7 + 5) < uVar20) {
        (bios->p).falcon_ucode.desc_size = bios->data[(ulong)uVar7 + 5];
        iVar5 = 0;
      }
      else {
        (bios->p).falcon_ucode.desc_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      (bios->p).falcon_ucode.valid =
           (((iVar11 == 0 && iVar18 == 0) && iVar8 == 0) && iVar9 == 0) && iVar5 == 0;
      bVar1 = (bios->p).falcon_ucode.entriesnum;
      peVar6 = (envy_bios_p_falcon_ucode_entry *)malloc((ulong)bVar1 << 6);
      (bios->p).falcon_ucode.entries = peVar6;
      if (bVar1 != 0) {
        lVar12 = 0;
        uVar13 = 0;
        uVar20 = 0;
        do {
          uVar15 = (ulong)((uint)(bios->p).falcon_ucode.rlen * (int)uVar13) +
                   (ulong)((uint)(bios->p).falcon_ucode.hlen + (uint)(bios->p).falcon_ucode.offset);
          *(short *)((long)&peVar6->offset + lVar12) = (short)uVar15;
          uVar7 = (uint)uVar15;
          if (uVar7 < bios->length) {
            (&peVar6->application_id)[lVar12] = bios->data[uVar15];
            uVar19 = 0;
          }
          else {
            (&peVar6->application_id)[lVar12] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",uVar15 & 0xffffffff);
            uVar19 = 0xfffffff2;
          }
          lVar10 = (uVar15 & 0xffffffff) + 1;
          peVar6 = (bios->p).falcon_ucode.entries;
          if ((uint)lVar10 < bios->length) {
            (&peVar6->target_id)[lVar12] = bios->data[lVar10];
            uVar16 = 0;
          }
          else {
            (&peVar6->target_id)[lVar12] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar16 = 0xfffffff2;
          }
          peVar6 = (bios->p).falcon_ucode.entries;
          if (uVar7 + 5 < bios->length) {
            *(undefined4 *)((long)&peVar6->desc_ptr + lVar12) =
                 *(undefined4 *)(bios->data + uVar15 + 2);
            uVar7 = 0;
          }
          else {
            *(undefined4 *)((long)&peVar6->desc_ptr + lVar12) = 0;
            fprintf(_stderr,"requested OOB u32 at 0x%04x\n",(ulong)(uVar7 + 2));
            peVar6 = (bios->p).falcon_ucode.entries;
            uVar7 = 0xfffffff2;
          }
          uVar20 = uVar19 | uVar20 | uVar16 | uVar7;
          uVar7 = *(uint *)((long)&peVar6->desc_ptr + lVar12);
          if ((ulong)uVar7 != 0) {
            *(uint *)((long)&(peVar6->desc).offset + lVar12) = uVar7;
            if (uVar7 + 3 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).stored_size + lVar12) =
                   CONCAT13(puVar3[uVar7 + 3],
                            CONCAT12(puVar3[uVar7 + 2],CONCAT11(puVar3[uVar7 + 1],puVar3[uVar7])));
              uVar19 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).stored_size + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n",(ulong)uVar7);
              peVar6 = (bios->p).falcon_ucode.entries;
              uVar19 = 0xfffffff2;
            }
            if (uVar7 + 7 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).uncompressed_size + lVar12) =
                   CONCAT13(puVar3[uVar7 + 7],
                            CONCAT12(puVar3[uVar7 + 6],CONCAT11(puVar3[uVar7 + 5],puVar3[uVar7 + 4])
                                    ));
              uVar16 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).uncompressed_size + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              uVar16 = 0xfffffff2;
            }
            if (uVar7 + 0xb < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).virtual_entry + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0xb],
                            CONCAT12(puVar3[uVar7 + 10],
                                     CONCAT11(puVar3[uVar7 + 9],puVar3[uVar7 + 8])));
              uVar14 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).virtual_entry + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              uVar14 = 0xfffffff2;
            }
            if (uVar7 + 0xf < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).interface_offset + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0xf],
                            CONCAT12(puVar3[uVar7 + 0xe],
                                     CONCAT11(puVar3[uVar7 + 0xd],puVar3[uVar7 + 0xc])));
              local_34 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).interface_offset + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              local_34 = 0xfffffff2;
            }
            if (uVar7 + 0x13 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).imem_phys_base + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x13],
                            CONCAT12(puVar3[uVar7 + 0x12],
                                     CONCAT11(puVar3[uVar7 + 0x11],puVar3[uVar7 + 0x10])));
              local_38 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).imem_phys_base + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              local_38 = 0xfffffff2;
            }
            if (uVar7 + 0x17 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).imem_load_size + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x17],
                            CONCAT12(puVar3[uVar7 + 0x16],
                                     CONCAT11(puVar3[uVar7 + 0x15],puVar3[uVar7 + 0x14])));
              local_3c = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).imem_load_size + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              local_3c = 0xfffffff2;
            }
            if (uVar7 + 0x1b < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).imem_virt_base + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x1b],
                            CONCAT12(puVar3[uVar7 + 0x1a],
                                     CONCAT11(puVar3[uVar7 + 0x19],puVar3[uVar7 + 0x18])));
              local_40 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).imem_virt_base + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              local_40 = 0xfffffff2;
            }
            if (uVar7 + 0x1f < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).imem_sec_base + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x1f],
                            CONCAT12(puVar3[uVar7 + 0x1e],
                                     CONCAT11(puVar3[uVar7 + 0x1d],puVar3[uVar7 + 0x1c])));
              uVar21 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).imem_sec_base + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              uVar21 = 0xfffffff2;
            }
            if (uVar7 + 0x23 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).imem_sec_size + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x23],
                            CONCAT12(puVar3[uVar7 + 0x22],
                                     CONCAT11(puVar3[uVar7 + 0x21],puVar3[uVar7 + 0x20])));
              local_44 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).imem_sec_size + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              local_44 = 0xfffffff2;
            }
            if (uVar7 + 0x27 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).dmem_offset + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x27],
                            CONCAT12(puVar3[uVar7 + 0x26],
                                     CONCAT11(puVar3[uVar7 + 0x25],puVar3[uVar7 + 0x24])));
              local_48 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).dmem_offset + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              local_48 = 0xfffffff2;
            }
            if (uVar7 + 0x2b < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).dmem_phys_base + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x2b],
                            CONCAT12(puVar3[uVar7 + 0x2a],
                                     CONCAT11(puVar3[uVar7 + 0x29],puVar3[uVar7 + 0x28])));
              uVar17 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).dmem_phys_base + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              uVar17 = 0xfffffff2;
            }
            if (uVar7 + 0x2f < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar6->desc).dmem_load_size + lVar12) =
                   CONCAT13(puVar3[uVar7 + 0x2f],
                            CONCAT12(puVar3[uVar7 + 0x2e],
                                     CONCAT11(puVar3[uVar7 + 0x2d],puVar3[uVar7 + 0x2c])));
              uVar7 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar6->desc).dmem_load_size + lVar12) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              peVar6 = (bios->p).falcon_ucode.entries;
              uVar7 = 0xfffffff2;
            }
            uVar20 = uVar20 | uVar21 | local_44 | local_48 | uVar17 |
                              local_38 | local_3c | local_40 | uVar14 | local_34 | uVar19 | uVar16 |
                              uVar7;
            (&(peVar6->desc).valid)[lVar12] = uVar20 == 0;
          }
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x40;
        } while (uVar13 < (bios->p).falcon_ucode.entriesnum);
      }
      iVar18 = 0;
    }
    else {
      envy_bios_parse_p_falcon_ucode_cold_1();
    }
  }
  return iVar18;
}

Assistant:

int
envy_bios_parse_p_falcon_ucode(struct envy_bios *bios)
{
	struct envy_bios_p_falcon_ucode *falcon_ucode = &bios->p.falcon_ucode;
	int i, err = 0;

	if (!falcon_ucode->offset)
		return -EINVAL;

	bios_u8(bios, falcon_ucode->offset + 0x0, &falcon_ucode->version);
	switch(falcon_ucode->version) {
	case 0x1:
		err |= bios_u8(bios, falcon_ucode->offset + 0x1, &falcon_ucode->hlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x2, &falcon_ucode->rlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x3, &falcon_ucode->entriesnum);

		err |= bios_u8(bios, falcon_ucode->offset + 0x4, &falcon_ucode->desc_version);
		err |= bios_u8(bios, falcon_ucode->offset + 0x5, &falcon_ucode->desc_size);
		falcon_ucode->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FALCON UCODE table version 0x%x\n", falcon_ucode->version);
		return -EINVAL;
	};

	err = 0;
	falcon_ucode->entries = malloc(falcon_ucode->entriesnum * sizeof(struct envy_bios_p_falcon_ucode_entry));
	for (i = 0; i < falcon_ucode->entriesnum; i++) {
		uint32_t data = falcon_ucode->offset + falcon_ucode->hlen + i * falcon_ucode->rlen;

		falcon_ucode->entries[i].offset = data;
		err |= bios_u8(bios, data + 0x0, &falcon_ucode->entries[i].application_id);
		err |= bios_u8(bios, data + 0x1, &falcon_ucode->entries[i].target_id);
		err |= bios_u32(bios, data + 0x2, &falcon_ucode->entries[i].desc_ptr);

		if (falcon_ucode->entries[i].desc_ptr) {
			uint32_t suboffset = falcon_ucode->entries[i].desc_ptr;

			falcon_ucode->entries[i].desc.offset = suboffset;
			err |= bios_u32(bios, suboffset + 0x0, &falcon_ucode->entries[i].desc.stored_size);
			err |= bios_u32(bios, suboffset + 0x4, &falcon_ucode->entries[i].desc.uncompressed_size);
			err |= bios_u32(bios, suboffset + 0x8, &falcon_ucode->entries[i].desc.virtual_entry);
			err |= bios_u32(bios, suboffset + 0xc, &falcon_ucode->entries[i].desc.interface_offset);
			err |= bios_u32(bios, suboffset + 0x10, &falcon_ucode->entries[i].desc.imem_phys_base);
			err |= bios_u32(bios, suboffset + 0x14, &falcon_ucode->entries[i].desc.imem_load_size);
			err |= bios_u32(bios, suboffset + 0x18, &falcon_ucode->entries[i].desc.imem_virt_base);
			err |= bios_u32(bios, suboffset + 0x1c, &falcon_ucode->entries[i].desc.imem_sec_base);
			err |= bios_u32(bios, suboffset + 0x20, &falcon_ucode->entries[i].desc.imem_sec_size);
			err |= bios_u32(bios, suboffset + 0x24, &falcon_ucode->entries[i].desc.dmem_offset);
			err |= bios_u32(bios, suboffset + 0x28, &falcon_ucode->entries[i].desc.dmem_phys_base);
			err |= bios_u32(bios, suboffset + 0x2c, &falcon_ucode->entries[i].desc.dmem_load_size);
			falcon_ucode->entries[i].desc.valid = !err;
		}
	}

	return 0;
}